

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

int64 __thiscall TTD::EventLog::GetFirstEventTimeInLog(EventLog *this)

{
  bool bVar1;
  EventLogEntry *pEVar2;
  int64 iVar3;
  undefined1 local_38 [8];
  Iterator iter;
  EventLog *this_local;
  
  iter.m_previousEventMap =
       (BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)this;
  TTEventList::GetIteratorAtFirst((Iterator *)local_38,&this->m_eventList);
  while( true ) {
    bVar1 = TTEventList::Iterator::IsValid((Iterator *)local_38);
    if (!bVar1) {
      return (int64)&DAT_ffffffffffffffff;
    }
    pEVar2 = TTEventList::Iterator::Current((Iterator *)local_38);
    bVar1 = NSLogEvents::IsJsRTActionRootCall(pEVar2);
    if (bVar1) break;
    TTEventList::Iterator::MoveNext((Iterator *)local_38);
  }
  pEVar2 = TTEventList::Iterator::Current((Iterator *)local_38);
  iVar3 = NSLogEvents::GetTimeFromRootCallOrSnapshot(pEVar2);
  return iVar3;
}

Assistant:

int64 EventLog::GetFirstEventTimeInLog() const
    {
        for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
        {
            if(NSLogEvents::IsJsRTActionRootCall(iter.Current()))
            {
                return NSLogEvents::GetTimeFromRootCallOrSnapshot(iter.Current());
            }
        }

        return -1;
    }